

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O3

mchunkptr try_realloc_chunk(mstate m,mchunkptr p,size_t nb,int can_move)

{
  tbinptr pmVar1;
  char *pcVar2;
  byte *pbVar3;
  uint uVar4;
  ulong uVar5;
  malloc_tree_chunk *pmVar6;
  malloc_tree_chunk *pmVar7;
  long lVar8;
  byte bVar9;
  tbinptr pmVar10;
  malloc_tree_chunk **ppmVar11;
  mchunkptr p_00;
  char *pcVar12;
  ulong uVar13;
  uint uVar14;
  size_t psize;
  size_t newsize;
  size_t newsize_1;
  mchunkptr pmVar15;
  tbinptr pmVar16;
  malloc_tree_chunk **ppmVar17;
  size_t __old_len;
  
  if (m < _gm_.least_addr) goto LAB_001056b9;
  uVar13 = m->dvsize;
  uVar14 = (uint)uVar13;
  if (((uVar14 & 3) == 1) || (pmVar15 = (mchunkptr)(uVar13 & 0xfffffffffffffff8), (long)pmVar15 < 1)
     ) goto LAB_001056b9;
  pmVar1 = (tbinptr)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&pmVar15[-3].bk)
  ;
  uVar5 = pmVar1->head;
  if ((uVar5 & 1) == 0) goto LAB_001056b9;
  if ((uVar13 & 3) == 0) {
    if (p < (mchunkptr)0x100) {
      return (mchunkptr)0x0;
    }
    if ((&p->head <= pmVar15) && ((ulong)((long)pmVar15 - (long)p) <= mparams.granularity * 2)) {
      return (mchunkptr)m;
    }
    lVar8 = *(long *)m;
    __old_len = (long)&pmVar15[1].prev_foot + lVar8;
    uVar13 = -mparams.page_size & (long)&p[1].bk + mparams.page_size + 6;
    pcVar12 = (char *)mremap((void *)((long)m - lVar8),__old_len,uVar13,(int)nb);
    if (pcVar12 == (char *)0xffffffffffffffff) {
      return (mchunkptr)0x0;
    }
    pmVar15 = (mchunkptr)(pcVar12 + lVar8);
    *(ulong *)(pcVar12 + lVar8 + 8) = (uVar13 - lVar8) + -0x20;
    pcVar2 = (char *)((uVar13 - lVar8) + -0x18 + (long)pmVar15);
    pcVar2[0] = '\v';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
    pcVar2 = pcVar12 + (uVar13 - 0x10);
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
    if (pcVar12 < _gm_.least_addr) {
      _gm_.least_addr = pcVar12;
    }
    _gm_.footprint = (uVar13 - __old_len) + _gm_.footprint;
    if (_gm_.max_footprint < _gm_.footprint) {
      _gm_.max_footprint = _gm_.footprint;
      return pmVar15;
    }
    return pmVar15;
  }
  p_00 = (mchunkptr)((long)pmVar15 - (long)p);
  if (p <= pmVar15) {
    if (p_00 < (mchunkptr)&DAT_00000020) {
      return (mchunkptr)m;
    }
    psize = (ulong)(uVar14 & 1) | (ulong)p | 2;
    m->dvsize = psize;
    *(ulong *)((long)&m->dvsize + (long)p) = (ulong)p_00 | 3;
    *(byte *)&pmVar1->head = (byte)pmVar1->head | 1;
    goto LAB_001054dc;
  }
  if (pmVar1 == (tbinptr)_gm_.top) {
    pmVar15 = (mchunkptr)((long)&pmVar15->prev_foot + _gm_.topsize);
    uVar13 = (long)pmVar15 - (long)p;
    if (pmVar15 < p || uVar13 == 0) {
      return (mchunkptr)0x0;
    }
    m->dvsize = (ulong)(uVar14 & 1) | (ulong)p | 2;
    *(ulong *)((long)&m->dvsize + (long)p) = uVar13 | 1;
    _gm_.topsize = uVar13;
    _gm_.top = (mchunkptr)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk)
    ;
    return (mchunkptr)m;
  }
  if (pmVar1 == (tbinptr)_gm_.dv) {
    pmVar15 = (mchunkptr)((long)&pmVar15->prev_foot + _gm_.dvsize);
    uVar13 = (long)pmVar15 - (long)p;
    if (pmVar15 < p) {
      return (mchunkptr)0x0;
    }
    if (uVar13 < 0x20) {
      m->dvsize = (ulong)(uVar14 & 1) | (ulong)pmVar15 | 2;
      pbVar3 = (byte *)((long)&m->dvsize + (long)pmVar15);
      *pbVar3 = *pbVar3 | 1;
      _gm_.dvsize = 0;
      _gm_.dv = (mchunkptr)0x0;
      return (mchunkptr)m;
    }
    m->dvsize = (ulong)(uVar14 & 1) | (ulong)p | 2;
    *(ulong *)((long)&m->dvsize + (long)p) = uVar13 | 1;
    *(ulong *)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&pmVar15[-3].bk) =
         uVar13;
    pbVar3 = (byte *)((long)&m->dvsize + (long)pmVar15);
    *pbVar3 = *pbVar3 & 0xfe;
    _gm_.dvsize = uVar13;
    _gm_.dv = (mchunkptr)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk);
    return (mchunkptr)m;
  }
  if ((uVar5 & 2) != 0) {
    return (mchunkptr)0x0;
  }
  pmVar15 = (mchunkptr)((long)&pmVar15->prev_foot + (uVar5 & 0xfffffffffffffff8));
  p_00 = (mchunkptr)((long)pmVar15 - (long)p);
  if (pmVar15 < p) {
    return (mchunkptr)0x0;
  }
  if (uVar5 < 0x100) {
    pmVar6 = pmVar1->fd;
    pmVar7 = pmVar1->bk;
    if ((pmVar6 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar5 >> 3) * 2)) &&
       ((pmVar6 < _gm_.least_addr || (pmVar6->bk != pmVar1)))) goto LAB_001056b9;
    if (pmVar7 == pmVar6) {
      bVar9 = (byte)(uVar5 >> 3) & 0x1f;
      _gm_.smallmap = _gm_.smallmap & (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
    }
    else {
      if ((pmVar7 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar5 >> 3) * 2)) &&
         ((pmVar7 < _gm_.least_addr || (pmVar7->fd != pmVar1)))) goto LAB_001056b9;
      pmVar6->bk = pmVar7;
      pmVar7->fd = pmVar6;
    }
  }
  else {
    pmVar16 = pmVar1->bk;
    pmVar6 = pmVar1->parent;
    if (pmVar16 == pmVar1) {
      if (pmVar1->child[1] == (tbinptr)0x0) {
        if (pmVar1->child[0] == (tbinptr)0x0) {
          pmVar16 = (tbinptr)0x0;
          goto LAB_00105632;
        }
        pmVar10 = pmVar1->child[0];
        ppmVar11 = pmVar1->child;
      }
      else {
        pmVar10 = pmVar1->child[1];
        ppmVar11 = pmVar1->child + 1;
      }
      do {
        do {
          ppmVar17 = ppmVar11;
          pmVar16 = pmVar10;
          pmVar10 = pmVar16->child[1];
          ppmVar11 = pmVar16->child + 1;
        } while (pmVar16->child[1] != (malloc_tree_chunk *)0x0);
        pmVar10 = pmVar16->child[0];
        ppmVar11 = pmVar16->child;
      } while (pmVar16->child[0] != (malloc_tree_chunk *)0x0);
      if (ppmVar17 < _gm_.least_addr) goto LAB_001056b9;
      *ppmVar17 = (malloc_tree_chunk *)0x0;
    }
    else {
      pmVar7 = pmVar1->fd;
      if (((pmVar7 < _gm_.least_addr) || (pmVar7->bk != pmVar1)) || (pmVar16->fd != pmVar1))
      goto LAB_001056b9;
      pmVar7->bk = pmVar16;
      pmVar16->fd = pmVar7;
    }
LAB_00105632:
    if (pmVar6 != (malloc_tree_chunk *)0x0) {
      uVar4 = pmVar1->index;
      if (pmVar1 == _gm_.treebins[uVar4]) {
        _gm_.treebins[uVar4] = pmVar16;
        if (pmVar16 == (tbinptr)0x0) {
          bVar9 = (byte)uVar4 & 0x1f;
          _gm_.treemap = _gm_.treemap & (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
        }
        else {
LAB_0010567b:
          pcVar12 = _gm_.least_addr;
          if (pmVar16 < _gm_.least_addr) {
LAB_001056b9:
            abort();
          }
          pmVar16->parent = pmVar6;
          pmVar6 = pmVar1->child[0];
          if (pmVar6 != (malloc_tree_chunk *)0x0) {
            if (pmVar6 < pcVar12) goto LAB_001056b9;
            pmVar16->child[0] = pmVar6;
            pmVar6->parent = pmVar16;
          }
          pmVar6 = pmVar1->child[1];
          if (pmVar6 != (malloc_tree_chunk *)0x0) {
            if (pmVar6 < pcVar12) goto LAB_001056b9;
            pmVar16->child[1] = pmVar6;
            pmVar6->parent = pmVar16;
          }
        }
      }
      else {
        if (pmVar6 < _gm_.least_addr) goto LAB_001056b9;
        pmVar6->child[pmVar6->child[0] != pmVar1] = pmVar16;
        if (pmVar16 != (tbinptr)0x0) goto LAB_0010567b;
      }
    }
  }
  if (p_00 < (mchunkptr)&DAT_00000020) {
    m->dvsize = (long)&pmVar15->prev_foot + (ulong)(uVar14 & 1) + 2;
    pbVar3 = (byte *)((long)&m->dvsize + (long)pmVar15);
    *pbVar3 = *pbVar3 | 1;
    return (mchunkptr)m;
  }
  psize = (ulong)(uVar14 & 1) | (ulong)p | 2;
  m->dvsize = psize;
  *(ulong *)((long)&m->dvsize + (long)p) = (ulong)p_00 | 3;
  pbVar3 = (byte *)((long)&m->dvsize + (long)pmVar15);
  *pbVar3 = *pbVar3 | 1;
LAB_001054dc:
  dispose_chunk((mstate)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk),
                p_00,psize);
  return (mchunkptr)m;
}

Assistant:

static mchunkptr try_realloc_chunk(mstate m, mchunkptr p, size_t nb,
                                   int can_move) {
  mchunkptr newp = 0;
  size_t oldsize = chunksize(p);
  mchunkptr next = chunk_plus_offset(p, oldsize);
  if (RTCHECK(ok_address(m, p) && ok_inuse(p) &&
              ok_next(p, next) && ok_pinuse(next))) {
    if (is_mmapped(p)) {
      newp = mmap_resize(m, p, nb, can_move);
    }
    else if (oldsize >= nb) {             /* already big enough */
      size_t rsize = oldsize - nb;
      if (rsize >= MIN_CHUNK_SIZE) {      /* split off remainder */
        mchunkptr r = chunk_plus_offset(p, nb);
        set_inuse(m, p, nb);
        set_inuse(m, r, rsize);
        dispose_chunk(m, r, rsize);
      }
      newp = p;
    }
    else if (next == m->top) {  /* extend into top */
      if (oldsize + m->topsize > nb) {
        size_t newsize = oldsize + m->topsize;
        size_t newtopsize = newsize - nb;
        mchunkptr newtop = chunk_plus_offset(p, nb);
        set_inuse(m, p, nb);
        newtop->head = newtopsize |PINUSE_BIT;
        m->top = newtop;
        m->topsize = newtopsize;
        newp = p;
      }
    }
    else if (next == m->dv) { /* extend into dv */
      size_t dvs = m->dvsize;
      if (oldsize + dvs >= nb) {
        size_t dsize = oldsize + dvs - nb;
        if (dsize >= MIN_CHUNK_SIZE) {
          mchunkptr r = chunk_plus_offset(p, nb);
          mchunkptr n = chunk_plus_offset(r, dsize);
          set_inuse(m, p, nb);
          set_size_and_pinuse_of_free_chunk(r, dsize);
          clear_pinuse(n);
          m->dvsize = dsize;
          m->dv = r;
        }
        else { /* exhaust dv */
          size_t newsize = oldsize + dvs;
          set_inuse(m, p, newsize);
          m->dvsize = 0;
          m->dv = 0;
        }
        newp = p;
      }
    }
    else if (!cinuse(next)) { /* extend into next free chunk */
      size_t nextsize = chunksize(next);
      if (oldsize + nextsize >= nb) {
        size_t rsize = oldsize + nextsize - nb;
        unlink_chunk(m, next, nextsize);
        if (rsize < MIN_CHUNK_SIZE) {
          size_t newsize = oldsize + nextsize;
          set_inuse(m, p, newsize);
        }
        else {
          mchunkptr r = chunk_plus_offset(p, nb);
          set_inuse(m, p, nb);
          set_inuse(m, r, rsize);
          dispose_chunk(m, r, rsize);
        }
        newp = p;
      }
    }
  }
  else {
    USAGE_ERROR_ACTION(m, chunk2mem(p));
  }
  return newp;
}